

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O3

ssize_t C_std::Write(int fd,void *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  string local_48;
  
  sVar1 = write(fd,buf,count);
  iVar3 = (int)sVar1;
  if (iVar3 < 0) {
    piVar2 = __errno_location();
    do {
      iVar3 = (int)sVar1;
      if ((*piVar2 != 4) && (*piVar2 != 0xb)) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"write error","");
        perror_exit(&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        break;
      }
      sVar1 = write(fd,buf,count);
      iVar3 = (int)sVar1;
    } while (iVar3 < 0);
  }
  return (long)iVar3;
}

Assistant:

ssize_t Write(int fd, const void *buf, size_t count) {
        AGAIN:
        int n = write(fd, buf, count);
        if (n < 0) {
            //出错处理
            if (errno == EAGAIN || errno == EWOULDBLOCK) {
                goto AGAIN;
            } else if (errno == EINTR) {
                //慢速系统调用，如果被注册捕捉函数的信号中断则重新读取
                goto AGAIN;
            } else {
                perror_exit("write error");
            }
        }
        return n;
    }